

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O0

feed_db_status_t store_feed_db(char *dir,feed_db_t *db,feed_t *feed_counter)

{
  FILE *pFVar1;
  FILE *fp_trips;
  FILE *fp_transfers;
  FILE *fp_stops;
  FILE *fp_stop_times;
  FILE *fp_shapes;
  FILE *fp_routes;
  FILE *fp_pathways;
  FILE *fp_levels;
  FILE *fp_frequencies;
  FILE *fp_feed_info;
  FILE *fp_fare_rules;
  FILE *fp_fare_attributes;
  FILE *fp_calendar_records;
  FILE *fp_calendar_dates;
  FILE *fp_agencies;
  feed_t instance;
  char *trips_fname;
  char *transfers_fname;
  char *stops_fname;
  char *stop_times_fname;
  char *shapes_fname;
  char *routes_fname;
  char *pathways_fname;
  char *levels_fname;
  char *frequencies_fname;
  char *feed_info_fname;
  char *fare_rules_fname;
  char *fare_attributes_fname;
  char *calendar_records_fname;
  char *calendar_dates_fname;
  char *agencies_fname;
  feed_t *pfStack_20;
  feed_db_status_t result;
  feed_t *feed_counter_local;
  feed_db_t *db_local;
  char *dir_local;
  
  agencies_fname._4_4_ = FEED_DB_SUCCESS;
  pfStack_20 = feed_counter;
  feed_counter_local = (feed_t *)db;
  db_local = (feed_db_t *)dir;
  make_filepath(&calendar_dates_fname,dir,"agency.txt");
  make_filepath(&calendar_records_fname,(char *)db_local,"calendar_dates.txt");
  make_filepath(&fare_attributes_fname,(char *)db_local,"calendar.txt");
  make_filepath(&fare_rules_fname,(char *)db_local,"fare_attributes.txt");
  make_filepath(&feed_info_fname,(char *)db_local,"fare_rules.txt");
  make_filepath(&frequencies_fname,(char *)db_local,"feed_info.txt");
  make_filepath(&levels_fname,(char *)db_local,"frequencies.txt");
  make_filepath(&pathways_fname,(char *)db_local,"levels.txt");
  make_filepath(&routes_fname,(char *)db_local,"pathways.txt");
  make_filepath(&shapes_fname,(char *)db_local,"routes.txt");
  make_filepath(&stop_times_fname,(char *)db_local,"shapes.txt");
  make_filepath(&stops_fname,(char *)db_local,"stop_times.txt");
  make_filepath(&transfers_fname,(char *)db_local,"stops.txt");
  make_filepath(&trips_fname,(char *)db_local,"transfers.txt");
  make_filepath((char **)&instance.trips_count,(char *)db_local,"trips.txt");
  init_feed((feed_t *)&fp_agencies);
  pFVar1 = fopen(calendar_dates_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.agencies._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.agencies._0_4_ = store_all_agencies_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(calendar_records_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.calendar_dates._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.calendar_dates._0_4_ =
         store_all_calendar_dates_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(fare_attributes_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.calendar_records._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.calendar_records._0_4_ =
         store_all_calendar_records_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(fare_rules_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.fare_attributes._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.fare_attributes._0_4_ =
         store_all_fare_attributes_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(feed_info_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.fare_rules._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.fare_rules._0_4_ =
         store_all_fare_rules_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(frequencies_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.feed_info._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.feed_info._0_4_ =
         store_all_feed_info_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(levels_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.frequencies._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.frequencies._0_4_ =
         store_all_frequencies_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(pathways_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.levels._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.levels._0_4_ = store_all_levels_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(routes_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.pathways._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.pathways._0_4_ = store_all_pathways_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(shapes_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.routes._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.routes._0_4_ = store_all_routes_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(stop_times_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.shapes._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.shapes._0_4_ = store_all_shapes_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(stops_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.stop_times._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.stop_times._0_4_ =
         store_all_stop_times_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(transfers_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.stops._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.stops._0_4_ = store_all_stops_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen(trips_fname,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.transfers._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.transfers._0_4_ =
         store_all_transfers_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  pFVar1 = fopen((char *)instance._232_8_,"r");
  if (pFVar1 == (FILE *)0x0) {
    instance.trips._0_4_ = -1;
    agencies_fname._4_4_ = FEED_DB_PARTIAL;
  }
  else {
    instance.trips._0_4_ = store_all_trips_db((FILE *)pFVar1,(feed_db_t *)feed_counter_local);
    fclose(pFVar1);
  }
  if (pfStack_20 != (feed_t *)0x0) {
    memcpy(pfStack_20,&fp_agencies,0xf0);
  }
  free(calendar_dates_fname);
  free(calendar_records_fname);
  free(fare_attributes_fname);
  free(fare_rules_fname);
  free(feed_info_fname);
  free(frequencies_fname);
  free(levels_fname);
  free(pathways_fname);
  free(routes_fname);
  free(shapes_fname);
  free(stop_times_fname);
  free(stops_fname);
  free(transfers_fname);
  free(trips_fname);
  free((void *)instance._232_8_);
  return agencies_fname._4_4_;
}

Assistant:

feed_db_status_t store_feed_db(const char *dir, feed_db_t *db, feed_t *feed_counter) {

    feed_db_status_t result = FEED_DB_SUCCESS;

    char *agencies_fname;
    char *calendar_dates_fname;
    char *calendar_records_fname;
    char *fare_attributes_fname;
    char *fare_rules_fname;
    char *feed_info_fname;
    char *frequencies_fname;
    char *levels_fname;
    char *pathways_fname;
    char *routes_fname;
    char *shapes_fname;
    char *stop_times_fname;
    char *stops_fname;
    char *transfers_fname;
    char *trips_fname;

    make_filepath(&agencies_fname, dir, "agency.txt");
    make_filepath(&calendar_dates_fname, dir, "calendar_dates.txt");
    make_filepath(&calendar_records_fname, dir, "calendar.txt");
    make_filepath(&fare_attributes_fname, dir, "fare_attributes.txt");
    make_filepath(&fare_rules_fname, dir, "fare_rules.txt");
    make_filepath(&feed_info_fname, dir, "feed_info.txt");
    make_filepath(&frequencies_fname, dir, "frequencies.txt");
    make_filepath(&levels_fname, dir, "levels.txt");
    make_filepath(&pathways_fname, dir, "pathways.txt");
    make_filepath(&routes_fname, dir, "routes.txt");
    make_filepath(&shapes_fname, dir, "shapes.txt");
    make_filepath(&stop_times_fname, dir, "stop_times.txt");
    make_filepath(&stops_fname, dir, "stops.txt");
    make_filepath(&transfers_fname, dir, "transfers.txt");
    make_filepath(&trips_fname, dir, "trips.txt");

    feed_t instance;
    init_feed(&instance);

    #ifdef CGTFS_STORING_BATCH_TRANSACTIONS_OFF
    if ((res = begin_transaction_db(db)) == FEED_DB_ERROR) {
        free(agencies_fname);
        free(calendar_dates_fname);
        free(calendar_records_fname);
        free(fare_attributes_fname);
        free(fare_rules_fname);
        free(feed_info_fname);
        free(frequencies_fname);
        free(levels_fname);
        free(pathways_fname);
        free(routes_fname);
        free(shapes_fname);
        free(stop_times_fname);
        free(stops_fname);
        free(transfers_fname);
        free(trips_fname);

        return FEED_DB_ERROR;
    }
    #endif

    FILE *fp_agencies = fopen(agencies_fname, "r");
    if (fp_agencies) {
        instance.agency_count = store_all_agencies_db(fp_agencies, db);
        fclose(fp_agencies);
    } else {
        instance.agency_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_calendar_dates = fopen(calendar_dates_fname, "r");
    if (fp_calendar_dates) {
        instance.calendar_dates_count = store_all_calendar_dates_db(fp_calendar_dates, db);
        fclose(fp_calendar_dates);
    } else {
        instance.calendar_dates_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_calendar_records = fopen(calendar_records_fname, "r");
    if (fp_calendar_records) {
        instance.calendar_records_count = store_all_calendar_records_db(fp_calendar_records, db);
        fclose(fp_calendar_records);
    } else {
        instance.calendar_records_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_fare_attributes = fopen(fare_attributes_fname, "r");
    if (fp_fare_attributes) {
        instance.fare_attributes_count = store_all_fare_attributes_db(fp_fare_attributes, db);
        fclose(fp_fare_attributes);
    } else {
        instance.fare_attributes_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_fare_rules = fopen(fare_rules_fname, "r");
    if (fp_fare_rules) {
        instance.fare_rules_count = store_all_fare_rules_db(fp_fare_rules, db);
        fclose(fp_fare_rules);
    } else {
        instance.fare_rules_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_feed_info = fopen(feed_info_fname, "r");
    if (fp_feed_info) {
        instance.feed_info_count = store_all_feed_info_db(fp_feed_info, db);
        fclose(fp_feed_info);
    } else {
        instance.feed_info_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_frequencies = fopen(frequencies_fname, "r");
    if (fp_frequencies) {
        instance.frequencies_count = store_all_frequencies_db(fp_frequencies, db);
        fclose(fp_frequencies);
    } else {
        instance.frequencies_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_levels = fopen(levels_fname, "r");
    if (fp_levels) {
        instance.levels_count = store_all_levels_db(fp_levels, db);
        fclose(fp_levels);
    } else {
        instance.levels_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_pathways = fopen(pathways_fname, "r");
    if (fp_pathways) {
        instance.pathways_count = store_all_pathways_db(fp_pathways, db);
        fclose(fp_pathways);
    } else {
        instance.pathways_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_routes = fopen(routes_fname, "r");
    if (fp_routes) {
        instance.routes_count = store_all_routes_db(fp_routes, db);
        fclose(fp_routes);
    } else {
        instance.routes_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_shapes = fopen(shapes_fname, "r");
    if (fp_shapes) {
        instance.shapes_count = store_all_shapes_db(fp_shapes, db);
        fclose(fp_shapes);
    } else {
        instance.shapes_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_stop_times = fopen(stop_times_fname, "r");
    if (fp_stop_times) {
        instance.stop_times_count = store_all_stop_times_db(fp_stop_times, db);
        fclose(fp_stop_times);
    } else {
        instance.stop_times_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_stops = fopen(stops_fname, "r");
    if (fp_stops) {
        instance.stops_count = store_all_stops_db(fp_stops, db);
        fclose(fp_stops);
    } else {
        instance.stops_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_transfers = fopen(transfers_fname, "r");
    if (fp_transfers) {
        instance.transfers_count = store_all_transfers_db(fp_transfers, db);
        fclose(fp_transfers);
    } else {
        instance.transfers_count = -1;
        result = FEED_DB_PARTIAL;
    }

    FILE *fp_trips = fopen(trips_fname, "r");
    if (fp_trips) {
        instance.trips_count = store_all_trips_db(fp_trips, db);
        fclose(fp_trips);
    } else {
        instance.trips_count = -1;
        result = FEED_DB_PARTIAL;
    }

    #ifdef CGTFS_STORING_BATCH_TRANSACTIONS_OFF
    end_transaction_db(db);
    #endif


    if (feed_counter != NULL)
        *feed_counter = instance;


    free(agencies_fname);
    free(calendar_dates_fname);
    free(calendar_records_fname);
    free(fare_attributes_fname);
    free(fare_rules_fname);
    free(feed_info_fname);
    free(frequencies_fname);
    free(levels_fname);
    free(pathways_fname);
    free(routes_fname);
    free(shapes_fname);
    free(stop_times_fname);
    free(stops_fname);
    free(transfers_fname);
    free(trips_fname);

    return result;
}